

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O2

Am_String get_default_filename(Am_Object *command_obj)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Object *in_RSI;
  Am_Object sel_widget;
  Am_Object local_18;
  
  Am_Object::Am_Object(&local_18,in_RSI);
  Am_Get_Selection_Widget_For_Command(&sel_widget);
  Am_Object::~Am_Object(&local_18);
  bVar1 = Am_Object::Valid(&sel_widget);
  if (bVar1) {
    in_value = Am_Object::Get(&sel_widget,0x19f,3);
    Am_String::Am_String((Am_String *)command_obj,in_value);
  }
  else {
    Am_String::Am_String((Am_String *)command_obj,&Am_No_String);
  }
  Am_Object::~Am_Object(&sel_widget);
  return (Am_String)(Am_String_Data *)command_obj;
}

Assistant:

Am_String
get_default_filename(Am_Object &command_obj)
{
  Am_Object sel_widget = Am_Get_Selection_Widget_For_Command(command_obj);
  if (sel_widget.Valid())
    return sel_widget.Get(Am_DEFAULT_LOAD_SAVE_FILENAME,
                          Am_RETURN_ZERO_ON_ERROR);
  else
    return Am_No_String;
}